

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

string __thiscall mjs::to_string(mjs *this,gc_heap *h,double m)

{
  undefined8 extraout_RDX;
  string sVar1;
  wstring local_50;
  wstring_view local_30;
  double local_20;
  double m_local;
  gc_heap *h_local;
  
  local_20 = m;
  m_local = (double)h;
  h_local = (gc_heap *)this;
  number_to_string_abi_cxx11_(&local_50,(mjs *)h,m);
  local_30 = (wstring_view)
             std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_50);
  string::string((string *)this,h,&local_30);
  std::__cxx11::wstring::~wstring((wstring *)&local_50);
  sVar1.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  sVar1.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar1.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string to_string(gc_heap& h, double m) {
    return string{h, number_to_string(m)};
}